

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool nivalis::anon_unknown_10::is_var_name_reserved(string *var_name)

{
  bool bVar1;
  
  bVar1 = std::operator==(var_name,"x");
  if (!bVar1) {
    bVar1 = std::operator==(var_name,"y");
    if (!bVar1) {
      bVar1 = std::operator==(var_name,"t");
      if (!bVar1) {
        bVar1 = std::operator==(var_name,"r");
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool is_var_name_reserved(const std::string& var_name) {
    return var_name == "x" || var_name == "y" ||
           var_name == "t" || var_name == "r";
}